

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O3

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::UncompressedStringSegmentState::GetHandle
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> _Var2;
  int iVar3;
  iterator iVar4;
  key_type_conflict in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  size_type *this_00;
  shared_ptr<duckdb::BlockHandle,_true> sVar5;
  key_type_conflict local_48;
  key_type_conflict local_40;
  _func_int **local_38;
  StringBlock *local_30;
  
  local_48 = in_RCX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&manager_p->metadata_manager);
  if (iVar3 == 0) {
    iVar4 = ::std::
            _Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<long,_std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)&manager_p[1].blocks_lock,&local_48);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      if ((manager_p->blocks)._M_h._M_element_count != 0) {
        this_00 = &(manager_p->blocks)._M_h._M_element_count;
        optional_ptr<duckdb::BlockManager,_true>::CheckValid
                  ((optional_ptr<duckdb::BlockManager,_true> *)this_00);
        block_id = *this_00;
      }
      sVar5 = BlockManager::RegisterBlock((BlockManager *)this,block_id);
      local_40 = local_48;
      local_38 = (this->super_CompressedSegmentState)._vptr_CompressedSegmentState;
      local_30 = (this->head).
                 super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
                 _M_t.
                 super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>
                 .super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl;
      if (local_30 != (StringBlock *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_30->block + 8);
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_30->block + 8);
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
      ::std::
      _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
                ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&manager_p[1].blocks_lock,&local_40,
                 sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      if (local_30 != (StringBlock *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
      }
    }
    else {
      (this->super_CompressedSegmentState)._vptr_CompressedSegmentState =
           *(_func_int ***)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
                   ._M_cur + 0x10);
      _Var2._M_head_impl =
           *(StringBlock **)
            ((long)iVar4.
                   super__Node_iterator_base<std::pair<const_long,_duckdb::shared_ptr<duckdb::BlockHandle,_true>_>,_false>
                   ._M_cur + 0x18);
      (this->head).super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
      _M_t.super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
      super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl = _Var2._M_head_impl;
      if (_Var2._M_head_impl != (StringBlock *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((_Var2._M_head_impl)->block).internal + 8);
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          UNLOCK();
        }
        else {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((_Var2._M_head_impl)->block).internal + 8);
          *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&manager_p->metadata_manager);
    sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::BlockHandle,_true>)
           sVar5.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

shared_ptr<BlockHandle> UncompressedStringSegmentState::GetHandle(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		return entry->second;
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, result));
	return result;
}